

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.hpp
# Opt level: O2

void __thiscall
OpenMD::TorsionStamp::setMembers(TorsionStamp *this,vector<int,_std::allocator<int>_> *members)

{
  ostream *poVar1;
  OpenMDException *this_00;
  vector<int,_std::allocator<int>_> *cont;
  string local_1b0;
  ostringstream oss;
  
  std::vector<int,_std::allocator<int>_>::operator=(&this->members_,members);
  if (0xfffffffffffffffd <
      ((long)(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) - 5U) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"members");
  containerToString<std::vector<int,std::allocator<int>>>(&local_1b0,(OpenMD *)members,cont);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  poVar1 = std::operator<<(poVar1," is invalid");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1b0);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1b0);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setMembers(const std::vector<int>& members) {
      members_ = members;
      if (members_.size() < 3 || members_.size() > 4) {
        std::ostringstream oss;
        oss << "members" << containerToString(members) << " is invalid"
            << std::endl;
        throw OpenMDException(oss.str());
      }
    }